

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tsqueue.h
# Opt level: O3

message<MsgType> * __thiscall
blcl::net::tsqueue<blcl::net::message<MsgType>_>::pop_front
          (message<MsgType> *__return_storage_ptr__,tsqueue<blcl::net::message<MsgType>_> *this)

{
  _Elt_pointer pmVar1;
  pointer puVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->queue_mtx_);
  if (iVar3 == 0) {
    pmVar1 = (this->raw_deque_).
             super__Deque_base<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    __return_storage_ptr__->header = pmVar1->header;
    puVar2 = (pmVar1->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pmVar1->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
    (__return_storage_ptr__->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pmVar1->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (pmVar1->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pmVar1->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pmVar1->body).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::deque<blcl::net::message<MsgType>,_std::allocator<blcl::net::message<MsgType>_>_>::
    pop_front(&this->raw_deque_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mtx_);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

T pop_front() {
            std::scoped_lock lock(queue_mtx_);
            auto t = std::move(raw_deque_.front());
            raw_deque_.pop_front();
            return t;
        }